

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O3

t_gotfn zgetfn(t_pd *x,t_symbol *s)

{
  int iVar1;
  t_gotfn *pp_Var2;
  
  iVar1 = (*x)->c_nmethod;
  if (iVar1 == 0) {
    return (t_gotfn)0x0;
  }
  pp_Var2 = &(*x)->c_methods->me_fun;
  do {
    if (((t_methodentry *)(pp_Var2 + -1))->me_name == s) {
      return *pp_Var2;
    }
    pp_Var2 = pp_Var2 + 3;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return (t_gotfn)0x0;
}

Assistant:

t_gotfn zgetfn(const t_pd *x, t_symbol *s)
{
    const t_class *c = *x;
    t_methodentry *m, *mlist;
    int i;

#ifdef PDINSTANCE
    mlist = c->c_methods[pd_this->pd_instanceno];
#else
    mlist = c->c_methods;
#endif
    for (i = c->c_nmethod, m = mlist; i--; m++)
        if (m->me_name == s) return(m->me_fun);
    return(0);
}